

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactor.c
# Opt level: O0

void interactor_return_seat(Interactor *itr)

{
  _Bool _Var1;
  Seat *seat;
  Seat *seat_00;
  Interactor *pIVar2;
  Interactor *itr_top;
  Seat *realseat;
  Seat *tempseat;
  Interactor *itr_local;
  
  seat = interactor_get_seat(itr);
  _Var1 = is_tempseat(seat);
  if (_Var1) {
    seat_00 = tempseat_get_real(seat);
    seat_set_trust_status(seat_00,true);
    tempseat_flush(seat);
    interactor_set_seat(itr,seat_00);
    tempseat_free(seat);
    pIVar2 = interactor_toplevel(itr,(uint *)0x0);
    if (pIVar2->last_to_talk != (Interactor *)0x0) {
      interactor_announce(itr);
    }
  }
  return;
}

Assistant:

void interactor_return_seat(Interactor *itr)
{
    Seat *tempseat = interactor_get_seat(itr);
    if (!is_tempseat(tempseat))
        return;                        /* no-op */

    /*
     * We're about to hand this seat back to the parent Interactor to
     * do its own thing with. It will typically expect to start in the
     * same state as if the seat had never been borrowed, i.e. in the
     * starting trust state.
     *
     * However, this may be overridden by the tempseat_flush call.
     */
    Seat *realseat = tempseat_get_real(tempseat);
    seat_set_trust_status(realseat, true);

    tempseat_flush(tempseat);
    interactor_set_seat(itr, realseat);
    tempseat_free(tempseat);

    /*
     * If we have a parent Interactor, and anyone has ever called
     * interactor_announce, then all Interactors from now on will
     * announce themselves even if they have nothing to say.
     */
    Interactor *itr_top = interactor_toplevel(itr, NULL);
    if (itr_top->last_to_talk)
        interactor_announce(itr);
}